

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::
     RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLin>>
               (RectRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLin> *renderer,
               ImDrawList *DrawList,ImRect *cull_rect)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  ImVec2 IVar5;
  GetterXsYs<double> *pGVar6;
  ImDrawVert *pIVar7;
  uint *puVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  float fVar19;
  double dVar20;
  float fVar21;
  double dVar22;
  float fVar23;
  ImVec2 IVar24;
  ImVec2 IVar25;
  float fVar26;
  
  uVar13 = renderer->Prims;
  if (uVar13 == 0) {
    uVar16 = 0;
  }
  else {
    IVar5 = DrawList->_Data->TexUvWhitePixel;
    iVar17 = 0;
    uVar16 = 0;
    do {
      uVar9 = ~DrawList->_VtxCurrentIdx >> 2;
      uVar18 = uVar9;
      if (uVar13 < uVar9) {
        uVar18 = uVar13;
      }
      uVar12 = 0x40;
      if (uVar13 < 0x40) {
        uVar12 = uVar13;
      }
      if (uVar9 < uVar12) {
        if (uVar16 != 0) {
          ImDrawList::PrimUnreserve(DrawList,uVar16 * 6,uVar16 << 2);
        }
        uVar16 = 0x3fffffff;
        uVar18 = 0x3fffffff;
        if (uVar13 < 0x3fffffff) {
          uVar16 = uVar13;
          uVar18 = uVar13;
        }
LAB_0042cd60:
        ImDrawList::PrimReserve(DrawList,uVar16 * 6,uVar16 * 4);
        uVar9 = 0;
      }
      else {
        uVar9 = uVar16 - uVar18;
        if (uVar16 < uVar18) {
          uVar16 = uVar18 - uVar16;
          goto LAB_0042cd60;
        }
      }
      uVar16 = uVar9;
      if (uVar18 != 0) {
        iVar15 = iVar17 * 2;
        iVar14 = 0;
        do {
          pGVar6 = renderer->Getter;
          iVar3 = pGVar6->Count;
          lVar10 = (long)(((iVar15 + pGVar6->Offset) % iVar3 + iVar3) % iVar3) *
                   (long)pGVar6->Stride;
          iVar4 = renderer->Transformer->YAxis;
          dVar20 = (double)GImPlot->PixelRange[iVar4].Min.x;
          dVar22 = (double)GImPlot->PixelRange[iVar4].Min.y;
          dVar1 = GImPlot->CurrentPlot->YAxis[iVar4].Range.Min;
          dVar2 = (GImPlot->CurrentPlot->XAxis).Range.Min;
          lVar11 = (long)(((iVar15 + pGVar6->Offset + 1) % iVar3 + iVar3) % iVar3) *
                   (long)pGVar6->Stride;
          fVar26 = (float)((*(double *)((long)pGVar6->Xs + lVar10) - dVar2) * GImPlot->Mx + dVar20);
          fVar23 = (float)((*(double *)((long)pGVar6->Ys + lVar10) - dVar1) * GImPlot->My[iVar4] +
                          dVar22);
          IVar24.y = fVar23;
          IVar24.x = fVar26;
          fVar19 = (float)((*(double *)((long)pGVar6->Xs + lVar11) - dVar2) * GImPlot->Mx + dVar20);
          fVar21 = (float)((*(double *)((long)pGVar6->Ys + lVar11) - dVar1) * GImPlot->My[iVar4] +
                          dVar22);
          DrawList->_VtxWritePtr->pos = IVar24;
          DrawList->_VtxWritePtr->uv = IVar5;
          pIVar7 = DrawList->_VtxWritePtr;
          pIVar7->col = renderer->Col;
          pIVar7[1].pos.x = fVar26;
          pIVar7[1].pos.y = fVar21;
          pIVar7[1].uv = IVar5;
          IVar25.y = fVar21;
          IVar25.x = fVar19;
          pIVar7 = DrawList->_VtxWritePtr;
          pIVar7[1].col = renderer->Col;
          pIVar7[2].pos = IVar25;
          DrawList->_VtxWritePtr[2].uv = IVar5;
          pIVar7 = DrawList->_VtxWritePtr;
          pIVar7[2].col = renderer->Col;
          pIVar7[3].pos.x = fVar19;
          pIVar7[3].pos.y = fVar23;
          pIVar7[3].uv = IVar5;
          pIVar7 = DrawList->_VtxWritePtr;
          pIVar7[3].col = renderer->Col;
          DrawList->_VtxWritePtr = pIVar7 + 4;
          puVar8 = DrawList->_IdxWritePtr;
          *puVar8 = DrawList->_VtxCurrentIdx;
          puVar8[1] = DrawList->_VtxCurrentIdx + 1;
          puVar8[2] = DrawList->_VtxCurrentIdx + 3;
          puVar8[3] = DrawList->_VtxCurrentIdx + 1;
          puVar8[4] = DrawList->_VtxCurrentIdx + 2;
          puVar8[5] = DrawList->_VtxCurrentIdx + 3;
          DrawList->_IdxWritePtr = puVar8 + 6;
          DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
          iVar14 = iVar14 + -1;
          iVar15 = iVar15 + 2;
        } while (-uVar18 != iVar14);
        iVar17 = iVar17 - iVar14;
      }
      uVar13 = uVar13 - uVar18;
    } while (uVar13 != 0);
  }
  if (uVar16 == 0) {
    return;
  }
  ImDrawList::PrimUnreserve(DrawList,uVar16 * 6,uVar16 << 2);
  return;
}

Assistant:

inline void RenderPrimitives(const Renderer& renderer, ImDrawList& DrawList, const ImRect& cull_rect) {
    unsigned int prims        = renderer.Prims;
    unsigned int prims_culled = 0;
    unsigned int idx          = 0;
    const ImVec2 uv = DrawList._Data->TexUvWhitePixel;
    while (prims) {
        // find how many can be reserved up to end of current draw command's limit
        unsigned int cnt = ImMin(prims, (MaxIdx<ImDrawIdx>::Value - DrawList._VtxCurrentIdx) / Renderer::VtxConsumed);
        // make sure at least this many elements can be rendered to avoid situations where at the end of buffer this slow path is not taken all the time
        if (cnt >= ImMin(64u, prims)) {
            if (prims_culled >= cnt)
                prims_culled -= cnt; // reuse previous reservation
            else {
                DrawList.PrimReserve((cnt - prims_culled) * Renderer::IdxConsumed, (cnt - prims_culled) * Renderer::VtxConsumed); // add more elements to previous reservation
                prims_culled = 0;
            }
        }
        else
        {
            if (prims_culled > 0) {
                DrawList.PrimUnreserve(prims_culled * Renderer::IdxConsumed, prims_culled * Renderer::VtxConsumed);
                prims_culled = 0;
            }
            cnt = ImMin(prims, (MaxIdx<ImDrawIdx>::Value - 0/*DrawList._VtxCurrentIdx*/) / Renderer::VtxConsumed);
            DrawList.PrimReserve(cnt * Renderer::IdxConsumed, cnt * Renderer::VtxConsumed); // reserve new draw command
        }
        prims -= cnt;
        for (unsigned int ie = idx + cnt; idx != ie; ++idx) {
            if (!renderer(DrawList, cull_rect, uv, idx))
                prims_culled++;
        }
    }
    if (prims_culled > 0)
        DrawList.PrimUnreserve(prims_culled * Renderer::IdxConsumed, prims_culled * Renderer::VtxConsumed);
}